

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O1

int getbits(archive_read_filter *self,int n)

{
  uint uVar1;
  long *plVar2;
  byte *pbVar3;
  long in_RAX;
  void *pvVar4;
  int iVar5;
  ssize_t ret;
  long local_28;
  
  plVar2 = (long *)self->data;
  iVar5 = *(int *)((long)plVar2 + 0x1c);
  local_28 = in_RAX;
  do {
    if (n <= iVar5) {
      uVar1 = *(uint *)(plVar2 + 3);
      *(int *)(plVar2 + 3) = (int)uVar1 >> ((byte)n & 0x1f);
      *(int *)((long)plVar2 + 0x1c) = iVar5 - n;
      return uVar1 & getbits::mask[n];
    }
    if (plVar2[1] == 0) {
      if (plVar2[2] != 0) {
        __archive_read_filter_consume(self->upstream,plVar2[2]);
        plVar2[2] = 0;
      }
      pvVar4 = __archive_read_filter_ahead(self->upstream,1,&local_28);
      *plVar2 = (long)pvVar4;
      if (local_28 == 0) {
        return -1;
      }
      if (local_28 < 0) {
        return -0x1e;
      }
      if (pvVar4 == (void *)0x0) {
        return -0x1e;
      }
      plVar2[1] = local_28;
      plVar2[2] = local_28;
    }
    pbVar3 = (byte *)*plVar2;
    *plVar2 = (long)(pbVar3 + 1);
    *(uint *)(plVar2 + 3) =
         *(uint *)(plVar2 + 3) | (uint)*pbVar3 << ((byte)*(int *)((long)plVar2 + 0x1c) & 0x1f);
    plVar2[1] = plVar2[1] + -1;
    iVar5 = *(int *)((long)plVar2 + 0x1c) + 8;
    *(int *)((long)plVar2 + 0x1c) = iVar5;
    plVar2[4] = plVar2[4] + 1;
  } while( true );
}

Assistant:

static int
getbits(struct archive_read_filter *self, int n)
{
	struct private_data *state = (struct private_data *)self->data;
	int code;
	ssize_t ret;
	static const int mask[] = {
		0x00, 0x01, 0x03, 0x07, 0x0f, 0x1f, 0x3f, 0x7f, 0xff,
		0x1ff, 0x3ff, 0x7ff, 0xfff, 0x1fff, 0x3fff, 0x7fff, 0xffff
	};

	while (state->bits_avail < n) {
		if (state->avail_in <= 0) {
			if (state->consume_unnotified) {
				__archive_read_filter_consume(self->upstream,
					state->consume_unnotified);
				state->consume_unnotified = 0;
			}
			state->next_in
			    = __archive_read_filter_ahead(self->upstream,
				1, &ret);
			if (ret == 0)
				return (-1);
			if (ret < 0 || state->next_in == NULL)
				return (ARCHIVE_FATAL);
			state->consume_unnotified = state->avail_in = ret;
		}
		state->bit_buffer |= *state->next_in++ << state->bits_avail;
		state->avail_in--;
		state->bits_avail += 8;
		state->bytes_in_section++;
	}

	code = state->bit_buffer;
	state->bit_buffer >>= n;
	state->bits_avail -= n;

	return (code & mask[n]);
}